

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

char * GPU_GetErrorString(GPU_ErrorEnum error)

{
  if (error < (GPU_ERROR_FILE_NOT_FOUND|GPU_ERROR_BACKEND_ERROR)) {
    return (&PTR_anon_var_dwarf_315d_001ddba0)[error];
  }
  return "UNKNOWN ERROR";
}

Assistant:

const char* GPU_GetErrorString(GPU_ErrorEnum error)
{
    switch(error)
    {
    case GPU_ERROR_NONE:
        return "NO ERROR";
    case GPU_ERROR_BACKEND_ERROR:
        return "BACKEND ERROR";
    case GPU_ERROR_DATA_ERROR:
        return "DATA ERROR";
    case GPU_ERROR_USER_ERROR:
        return "USER ERROR";
    case GPU_ERROR_UNSUPPORTED_FUNCTION:
        return "UNSUPPORTED FUNCTION";
    case GPU_ERROR_NULL_ARGUMENT:
        return "NULL ARGUMENT";
    case GPU_ERROR_FILE_NOT_FOUND:
        return "FILE NOT FOUND";
    }
    return "UNKNOWN ERROR";
}